

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvrp-instance-modifier.c
# Opt level: O0

Instance * process_instance(Instance *__return_storage_ptr__,Instance *instance,AppCtx *ctx)

{
  double dVar1;
  int32_t local_2c;
  AppCtx *ctx_local;
  Instance *instance_local;
  
  instance_copy(__return_storage_ptr__,instance,true,true);
  if ((ctx->cap_scale_factor != 1.0) || (NAN(ctx->cap_scale_factor))) {
    __return_storage_ptr__->vehicle_cap =
         __return_storage_ptr__->vehicle_cap * ctx->cap_scale_factor;
    dVar1 = ceil((double)__return_storage_ptr__->num_vehicles / ctx->cap_scale_factor);
    __return_storage_ptr__->num_vehicles = (int)dVar1;
  }
  if (__return_storage_ptr__->num_vehicles < 2) {
    local_2c = 1;
  }
  else {
    local_2c = __return_storage_ptr__->num_vehicles;
  }
  __return_storage_ptr__->num_vehicles = local_2c;
  return __return_storage_ptr__;
}

Assistant:

Instance process_instance(const Instance *instance, const AppCtx *ctx) {
    Instance result = instance_copy(instance, true, true);

    if (ctx->cap_scale_factor != 1.0) {
        result.vehicle_cap = result.vehicle_cap * ctx->cap_scale_factor;
        result.num_vehicles = (int32_t)(ceil((double)result.num_vehicles /
                                             ctx->cap_scale_factor));
    }

    result.num_vehicles = MAX(1, result.num_vehicles);
    return result;
}